

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

extent_t *
extent_alloc_wrapper_hard
          (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,void *new_addr,size_t size,
          size_t pad,size_t alignment,_Bool slab,szind_t szind,_Bool *zero,_Bool *commit)

{
  byte bVar1;
  _Bool _Var2;
  uint uVar3;
  extent_t *extent_00;
  tsdn_t *tsdn_00;
  extent_t *extent_01;
  arena_t *in_RCX;
  long *in_RDX;
  arena_t *in_RSI;
  long in_R8;
  _Bool *in_R9;
  long in_stack_00000008;
  byte in_stack_00000010;
  undefined4 in_stack_00000018;
  byte *in_stack_00000020;
  byte *in_stack_00000028;
  size_t in_stack_00000078;
  extent_t *in_stack_00000080;
  tsdn_t *in_stack_00000088;
  size_t palignment;
  void *addr;
  extent_t *extent;
  size_t esize;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar4;
  undefined1 in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff15;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  undefined1 in_stack_ffffffffffffff1f;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  extent_t *extent_02;
  undefined1 growing_retained;
  extent_state_t in_stack_ffffffffffffff58;
  extent_hooks_t **in_stack_ffffffffffffff60;
  arena_t *in_stack_ffffffffffffff68;
  extent_t *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  byte *pbVar5;
  void *in_stack_ffffffffffffff88;
  byte *pbVar6;
  arena_t *in_stack_ffffffffffffff90;
  code *pcVar7;
  void *local_60;
  extent_t *local_10;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  bVar1 = in_stack_00000010 & 1;
  extent_00 = (extent_t *)(in_R9 + in_R8);
  local_10 = extent_alloc((tsdn_t *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                          (arena_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (local_10 == (extent_t *)0x0) {
    local_10 = (extent_t *)0x0;
  }
  else {
    tsdn_00 = (tsdn_t *)(in_stack_00000008 + 0xfffU & 0xfffffffffffff000);
    if ((extent_hooks_t *)*in_RDX == &extent_hooks_default) {
      local_60 = extent_alloc_default_impl
                           (tsdn_00,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                            in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                            (_Bool *)in_stack_ffffffffffffff70,in_R9);
      in_RCX = in_stack_ffffffffffffff68;
    }
    else {
      extent_hook_pre_reentrancy
                ((tsdn_t *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 (arena_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      pcVar7 = *(code **)*in_RDX;
      in_stack_ffffffffffffff60 = (extent_hooks_t **)*in_RDX;
      in_stack_ffffffffffffff70 = extent_00;
      pbVar5 = in_stack_00000020;
      pbVar6 = in_stack_00000028;
      uVar3 = arena_ind_get((arena_t *)0x166d52);
      local_60 = (void *)(*pcVar7)(in_stack_ffffffffffffff60,in_RCX,in_stack_ffffffffffffff70,
                                   tsdn_00,pbVar5,pbVar6,CONCAT44(uVar4,uVar3));
      extent_hook_post_reentrancy
                ((tsdn_t *)
                 CONCAT17(in_stack_ffffffffffffff17,
                          CONCAT16(in_stack_ffffffffffffff16,
                                   CONCAT15(in_stack_ffffffffffffff15,
                                            CONCAT14(in_stack_ffffffffffffff14,
                                                     in_stack_ffffffffffffff10)))));
    }
    if (local_60 == (void *)0x0) {
      extent_dalloc((tsdn_t *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                    (arena_t *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                    (extent_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      local_10 = (extent_t *)0x0;
    }
    else {
      extent_02 = local_10;
      extent_01 = (extent_t *)arena_extent_sn_next(in_RSI);
      growing_retained = (undefined1)((ulong)local_60 >> 0x38);
      uVar4 = 0;
      extent_init(extent_02,(arena_t *)CONCAT17(bVar1,in_stack_ffffffffffffff30),
                  (void *)CONCAT44(in_stack_ffffffffffffff2c,1),
                  CONCAT44(in_stack_ffffffffffffff24,(uint)(*in_stack_00000028 & 1)),
                  (_Bool)in_stack_ffffffffffffff1f,(uint)(*in_stack_00000020 & 1),(size_t)extent_00,
                  in_stack_ffffffffffffff58,(_Bool)in_stack_ffffffffffffff17,
                  (_Bool)in_stack_ffffffffffffff16,(_Bool)in_stack_ffffffffffffff15);
      if (in_R9 != (_Bool *)0x0) {
        extent_addr_randomize(in_stack_00000088,in_stack_00000080,in_stack_00000078);
      }
      _Var2 = extent_register((tsdn_t *)
                              CONCAT17(in_stack_ffffffffffffff17,
                                       CONCAT16(in_stack_ffffffffffffff16,
                                                CONCAT15(in_stack_ffffffffffffff15,
                                                         CONCAT14(in_stack_ffffffffffffff14,uVar4)))
                                      ),extent_01);
      if (_Var2) {
        extents_leak((tsdn_t *)in_stack_ffffffffffffff70,in_RCX,in_stack_ffffffffffffff60,
                     (extents_t *)CONCAT44(in_stack_00000018,in_stack_ffffffffffffff58),extent_00,
                     (_Bool)growing_retained);
        local_10 = (extent_t *)0x0;
      }
    }
  }
  return local_10;
}

Assistant:

static extent_t *
extent_alloc_wrapper_hard(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, void *new_addr, size_t size, size_t pad,
    size_t alignment, bool slab, szind_t szind, bool *zero, bool *commit) {
	size_t esize = size + pad;
	extent_t *extent = extent_alloc(tsdn, arena);
	if (extent == NULL) {
		return NULL;
	}
	void *addr;
	size_t palignment = ALIGNMENT_CEILING(alignment, PAGE);
	if (*r_extent_hooks == &extent_hooks_default) {
		/* Call directly to propagate tsdn. */
		addr = extent_alloc_default_impl(tsdn, arena, new_addr, esize,
		    palignment, zero, commit);
	} else {
		extent_hook_pre_reentrancy(tsdn, arena);
		addr = (*r_extent_hooks)->alloc(*r_extent_hooks, new_addr,
		    esize, palignment, zero, commit, arena_ind_get(arena));
		extent_hook_post_reentrancy(tsdn);
	}
	if (addr == NULL) {
		extent_dalloc(tsdn, arena, extent);
		return NULL;
	}
	extent_init(extent, arena, addr, esize, slab, szind,
	    arena_extent_sn_next(arena), extent_state_active, *zero, *commit,
	    true);
	if (pad != 0) {
		extent_addr_randomize(tsdn, extent, alignment);
	}
	if (extent_register(tsdn, extent)) {
		extents_leak(tsdn, arena, r_extent_hooks,
		    &arena->extents_retained, extent, false);
		return NULL;
	}

	return extent;
}